

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

char * nk_str_at_const(nk_str *str,int pos,nk_rune *unicode,int *len)

{
  int clen;
  char *c;
  int iVar1;
  int iVar2;
  bool bVar3;
  
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x2173,
                  "const char *nk_str_at_const(const struct nk_str *, int, nk_rune *, int *)");
  }
  if (unicode == (nk_rune *)0x0) {
    __assert_fail("unicode",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x2174,
                  "const char *nk_str_at_const(const struct nk_str *, int, nk_rune *, int *)");
  }
  if (len == (int *)0x0) {
    __assert_fail("len",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/devkitPro[P]glfw/deps/nuklear.h"
                  ,0x2175,
                  "const char *nk_str_at_const(const struct nk_str *, int, nk_rune *, int *)");
  }
  if (pos < 0) {
    *unicode = 0;
    *len = 0;
  }
  else {
    c = (char *)(str->buffer).memory.ptr;
    clen = (int)(str->buffer).allocated;
    iVar1 = nk_utf_decode(c,unicode,clen);
    iVar2 = 0;
    while (iVar1 != 0) {
      bVar3 = pos == 0;
      pos = pos + -1;
      if (bVar3) {
        *len = iVar1;
        goto LAB_0011f740;
      }
      iVar2 = iVar2 + iVar1;
      iVar1 = nk_utf_decode(c + iVar2,unicode,clen - iVar2);
    }
    if (pos == 0) {
LAB_0011f740:
      return c + iVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

NK_API const char*
nk_str_at_const(const struct nk_str *str, int pos, nk_rune *unicode, int *len)
{
    int i = 0;
    int src_len = 0;
    int glyph_len = 0;
    char *text;
    int text_len;

    NK_ASSERT(str);
    NK_ASSERT(unicode);
    NK_ASSERT(len);

    if (!str || !unicode || !len) return 0;
    if (pos < 0) {
        *unicode = 0;
        *len = 0;
        return 0;
    }

    text = (char*)str->buffer.memory.ptr;
    text_len = (int)str->buffer.allocated;
    glyph_len = nk_utf_decode(text, unicode, text_len);
    while (glyph_len) {
        if (i == pos) {
            *len = glyph_len;
            break;
        }

        i++;
        src_len = src_len + glyph_len;
        glyph_len = nk_utf_decode(text + src_len, unicode, text_len - src_len);
    }
    if (i != pos) return 0;
    return text + src_len;
}